

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int dtype_convert_simple(void *dst,char *dstdtype,void *src,char *srcdtype,size_t nmemb)

{
  int iVar1;
  size_t nmemb_local;
  BigArray dst_array;
  BigArrayIter src_iter;
  BigArrayIter dst_iter;
  BigArray src_array;
  
  nmemb_local = nmemb;
  big_array_init(&dst_array,dst,dstdtype,1,&nmemb_local,(ptrdiff_t *)0x0);
  big_array_init(&src_array,src,srcdtype,1,&nmemb_local,(ptrdiff_t *)0x0);
  big_array_iter_init(&dst_iter,&dst_array);
  big_array_iter_init(&src_iter,&src_array);
  iVar1 = _dtype_convert(&dst_iter,&src_iter,nmemb);
  return iVar1;
}

Assistant:

static int
dtype_convert_simple(void * dst, const char * dstdtype, const void * src, const char * srcdtype, size_t nmemb)
{
    BigArray dst_array, src_array;
    BigArrayIter dst_iter, src_iter;
    big_array_init(&dst_array, dst, dstdtype, 1, &nmemb, NULL);
    big_array_init(&src_array, (void*) src, srcdtype, 1, &nmemb, NULL);
    big_array_iter_init(&dst_iter, &dst_array);
    big_array_iter_init(&src_iter, &src_array);
    return _dtype_convert(&dst_iter, &src_iter, nmemb);
}